

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O2

void ga_init_nbhandle(Integer *nbhandle)

{
  ulong uVar1;
  uint uVar2;
  undefined8 in_RAX;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  gai_nbhdl_t *oldhdl;
  ga_nbhdl_array_t *pgVar8;
  Integer itmp;
  uint local_28;
  undefined4 uStack_24;
  
  uVar1 = (long)(lastGAhandle + 1) % (long)nb_max_outstanding;
  uVar5 = uVar1 & 0xffffffff;
  uVar6 = (uint)uVar1;
  do {
    iVar3 = (int)uVar5;
    if ((int)(uVar6 + nb_max_outstanding) <= iVar3) {
      pgVar8 = ga_ihdl_array + (int)uVar6;
      if (ga_ihdl_array[(int)uVar6].ahandle == (ga_armcihdl_t *)0x0) goto LAB_00195920;
      uVar7 = uVar6 & 0xff;
      _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),
                           ga_ihdl_array[(int)uVar6].ga_nbtag << 8 | uVar7);
      lastGAhandle = uVar6;
      nga_wait_internal((Integer *)&local_28);
      goto LAB_00195924;
    }
    uVar7 = iVar3 % nb_max_outstanding;
    uVar5 = (ulong)(iVar3 + 1);
  } while (ga_ihdl_array[(int)uVar7].ahandle != (ga_armcihdl_t *)0x0);
  pgVar8 = ga_ihdl_array + (int)uVar7;
  uVar6 = uVar7;
LAB_00195920:
  uVar7 = uVar6 & 0xff;
LAB_00195924:
  uVar2 = ga_nb_tag + 1;
  uVar4 = uVar2 & 0xffffff;
  ga_nb_tag = uVar4;
  *(uint *)nbhandle = uVar2 * 0x100 | uVar7;
  pgVar8->ahandle = (ga_armcihdl_t *)0x0;
  pgVar8->count = 0;
  pgVar8->active = 1;
  pgVar8->ga_nbtag = uVar4;
  lastGAhandle = uVar6;
  return;
}

Assistant:

void ga_init_nbhandle(Integer *nbhandle)
{
  int i, top, idx, iloc;
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  lastGAhandle++;
  lastGAhandle = lastGAhandle%nb_max_outstanding;
  top = lastGAhandle+nb_max_outstanding;
  /* default index if no handles are available */
  idx = lastGAhandle;
  for (i=lastGAhandle; i<top; i++) {
    iloc = i%nb_max_outstanding;
    if (ga_ihdl_array[iloc].ahandle == NULL) {
      idx = iloc;
      break;
    }
  }
  /* If no free handle is found, clear the oldest handle */
  if (ga_ihdl_array[idx].ahandle != NULL) {
    Integer itmp;
    /* find value of itmp corresponding to oldest handle */
    gai_nbhdl_t *oldhdl = (gai_nbhdl_t*)&itmp;
    oldhdl->ihdl_index = idx;
    oldhdl->ga_nbtag = ga_ihdl_array[idx].ga_nbtag;
    nga_wait_internal(&itmp);
  }
  inbhandle->ihdl_index = idx;
  inbhandle->ga_nbtag = get_next_tag();
  ga_ihdl_array[idx].ahandle = NULL;
  ga_ihdl_array[idx].count = 0;
  ga_ihdl_array[idx].active = 1;
  ga_ihdl_array[idx].ga_nbtag = inbhandle->ga_nbtag;

  /* reset lastGAhandle to idx */
  lastGAhandle = idx;
  return;
}